

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relivedb.hpp
# Opt level: O1

long __thiscall relive::ReLiveDB::getConfigValue<long>(ReLiveDB *this,string *key,long *defaultVal)

{
  long val;
  ostringstream os;
  istringstream is;
  string local_358;
  string local_338;
  ostringstream local_318 [112];
  ios_base local_2a8 [264];
  istringstream local_1a0 [120];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_318);
  std::ostream::_M_insert<long>((long)local_318);
  std::__cxx11::stringbuf::str();
  getConfigValueString(&local_358,this,key,&local_338);
  std::__cxx11::istringstream::istringstream(local_1a0,(string *)&local_358,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  std::istream::_M_extract<long>((long *)local_1a0);
  std::__cxx11::istringstream::~istringstream(local_1a0);
  std::ios_base::~ios_base(local_128);
  std::__cxx11::ostringstream::~ostringstream(local_318);
  std::ios_base::~ios_base(local_2a8);
  return (long)local_358._M_dataplus._M_p;
}

Assistant:

T getConfigValue(const std::string& key, const T& defaultVal = T())
    {
        std::ostringstream os;
        os << defaultVal;
        std::istringstream is(getConfigValueString(key, os.str()));
        T val;
        is >> val;
        return val;
    }